

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
ValidationCache::ValidationCache
          (ValidationCache *this,size_t script_execution_cache_bytes,size_t signature_cache_bytes)

{
  long lVar1;
  long in_FS_OFFSET;
  string_view source_file;
  pair<unsigned_int,_unsigned_long> pVar2;
  string_view logging_function;
  ulong local_68;
  ulong local_60;
  uint local_58 [2];
  ulong local_50;
  uint256 nonce;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->m_script_execution_cache_hasher);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&this->m_script_execution_cache);
  SignatureCache::SignatureCache(&this->m_signature_cache,signature_cache_bytes);
  GetRandHash();
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  pVar2 = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
                    (&this->m_script_execution_cache,script_execution_cache_bytes);
  local_50 = pVar2.second;
  local_58[0] = pVar2.first;
  local_60 = local_50 >> 0x14;
  local_68 = script_execution_cache_bytes >> 0x14;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  logging_function._M_str = "ValidationCache";
  logging_function._M_len = 0xf;
  LogPrintFormatInternal<unsigned_long,unsigned_long,unsigned_int>
            (logging_function,source_file,0x83c,ALL,Info,(ConstevalFormatString<3U>)0xcd1159,
             &local_60,&local_68,local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationCache::ValidationCache(const size_t script_execution_cache_bytes, const size_t signature_cache_bytes)
    : m_signature_cache{signature_cache_bytes}
{
    // Setup the salted hasher
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy twice to fill the 64 bytes.
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);

    const auto [num_elems, approx_size_bytes] = m_script_execution_cache.setup_bytes(script_execution_cache_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n",
              approx_size_bytes >> 20, script_execution_cache_bytes >> 20, num_elems);
}